

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  allocator<char> local_139;
  string local_138;
  _Vector_base<TCacheReq,_std::allocator<TCacheReq>_> local_118;
  TProblem p;
  
  if (argc != 3) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"usage: ");
    poVar1 = std::operator<<(poVar1,*argv);
    poVar1 = std::operator<<(poVar1," INPUT OUTPUT");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,argv[1],(allocator<char> *)&local_118);
    Read(&p,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,argv[2],&local_139);
    PriorityQueueAssignment((vector<TCacheReq,_std::allocator<TCacheReq>_> *)&local_118,&p);
    Write(&local_138,(vector<TCacheReq,_std::allocator<TCacheReq>_> *)&local_118);
    std::_Vector_base<TCacheReq,_std::allocator<TCacheReq>_>::~_Vector_base(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    TProblem::~TProblem(&p);
  }
  return (uint)(argc != 3);
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc != 3) {
        std::cerr << "usage: " << argv[0] << " INPUT OUTPUT" << std::endl;
        return 1;
    }

    auto p = Read(argv[1]);

    Write(argv[2], PriorityQueueAssignment(p));

    return 0;
}